

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

int libtorrent::anon_unknown_1::load_file
              (string *filename,vector<char,_std::allocator<char>_> *v,error_code *ec,
              int max_buffer_size)

{
  pointer __ptr;
  file_pointer __stream;
  int iVar1;
  int iVar2;
  FILE *__stream_00;
  size_type __new_size;
  size_t __new_size_00;
  int *piVar3;
  file_pointer f;
  
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  __stream_00 = fopen64((filename->_M_dataplus)._M_p,"rb");
  f.ptr = (FILE *)__stream_00;
  if (__stream_00 == (FILE *)0x0) {
LAB_0031a9a2:
    piVar3 = __errno_location();
    boost::system::error_code::assign
              (ec,*piVar3,
               &boost::system::detail::cat_holder<void>::generic_category_instance.
                super_error_category);
  }
  else {
    iVar1 = fseek(__stream_00,0,2);
    if (iVar1 < 0) goto LAB_0031a9a2;
    __new_size = ftell(__stream_00);
    if ((long)__new_size < 0) goto LAB_0031a9a2;
    if ((long)__new_size <= (long)max_buffer_size) {
      iVar1 = fseek(__stream_00,0,0);
      if (-1 < iVar1) {
        ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size);
        __stream = f;
        iVar1 = 0;
        if (__new_size == 0) goto LAB_0031a9bb;
        __ptr = (v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
                ._M_start;
        __new_size_00 =
             fread(__ptr,1,(long)(v->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)__ptr,(FILE *)f.ptr);
        iVar1 = 0;
        if (__new_size_00 == __new_size) goto LAB_0031a9bb;
        iVar2 = feof((FILE *)__stream.ptr);
        if (iVar2 != 0) {
          ::std::vector<char,_std::allocator<char>_>::resize(v,__new_size_00);
          goto LAB_0031a9bb;
        }
      }
      goto LAB_0031a9a2;
    }
    boost::system::error_code::operator=(ec,metadata_too_large);
  }
  iVar1 = -1;
LAB_0031a9bb:
  aux::file_pointer::~file_pointer(&f);
  return iVar1;
}

Assistant:

int load_file(std::string const& filename, std::vector<char>& v
		, error_code& ec, int const max_buffer_size = 80000000)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		aux::file_pointer f(::_wfopen(convert_to_native_path_string(filename).c_str(), L"rb"));
#else
		aux::file_pointer f(std::fopen(filename.c_str(), "rb"));
#endif
		if (f.file() == nullptr)
		{
			ec.assign(errno, generic_category());
			return -1;
		}

		if (std::fseek(f.file(), 0, SEEK_END) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		std::int64_t const s = std::ftell(f.file());
		if (s < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		if (s > max_buffer_size)
		{
			ec = errors::metadata_too_large;
			return -1;
		}
		if (std::fseek(f.file(), 0, SEEK_SET) < 0)
		{
			ec.assign(errno, generic_category());
			return -1;
		}
		v.resize(std::size_t(s));
		if (s == 0) return 0;
		std::size_t const read = std::fread(v.data(), 1, v.size(), f.file());
		if (read != std::size_t(s))
		{
			if (std::feof(f.file()))
			{
				v.resize(read);
				return 0;
			}
			ec.assign(errno, generic_category());
			return -1;
		}
		return 0;
	}